

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context.c
# Opt level: O0

lys_module * ly_ctx_load_module(ly_ctx *ctx,char *name,char *revision,char **features)

{
  LY_ERR local_3c;
  ly_ctx *plStack_38;
  LY_ERR ret;
  lys_module *mod;
  char **features_local;
  char *revision_local;
  char *name_local;
  ly_ctx *ctx_local;
  
  plStack_38 = (ly_ctx *)0x0;
  mod = (lys_module *)features;
  features_local = (char **)revision;
  revision_local = name;
  name_local = (char *)ctx;
  if (ctx == (ly_ctx *)0x0) {
    ly_log((ly_ctx *)0x0,LY_LLERR,LY_EINVAL,"Invalid argument %s (%s()).","ctx","ly_ctx_load_module"
          );
    ctx_local = (ly_ctx *)0x0;
  }
  else if (name == (char *)0x0) {
    ly_log(ctx,LY_LLERR,LY_EINVAL,"Invalid argument %s (%s()).","name","ly_ctx_load_module");
    ctx_local = (ly_ctx *)0x0;
  }
  else {
    local_3c = lys_parse_load(ctx,name,revision,&(ctx->unres).creating,
                              (lys_module **)&stack0xffffffffffffffc8);
    if ((((local_3c == LY_SUCCESS) &&
         (local_3c = _lys_set_implemented
                               ((lys_module *)plStack_38,(char **)mod,
                                (lys_glob_unres *)(name_local + 0x60)), local_3c == LY_SUCCESS)) &&
        ((*(ushort *)(name_local + 0x102) & 0x80) == 0)) &&
       ((local_3c = lys_unres_dep_sets_create
                              ((ly_ctx *)name_local,(ly_set *)(name_local + 0x60),
                               (lys_module *)plStack_38), local_3c == LY_SUCCESS &&
        (local_3c = lys_compile_depset_all
                              ((ly_ctx *)name_local,(lys_glob_unres *)(name_local + 0x60)),
        local_3c == LY_SUCCESS)))) {
      lys_unres_glob_erase((lys_glob_unres *)(name_local + 0x60));
    }
    if (local_3c != LY_SUCCESS) {
      lys_unres_glob_revert((ly_ctx *)name_local,(lys_glob_unres *)(name_local + 0x60));
      lys_unres_glob_erase((lys_glob_unres *)(name_local + 0x60));
      plStack_38 = (ly_ctx *)0x0;
    }
    ctx_local = plStack_38;
  }
  return (lys_module *)ctx_local;
}

Assistant:

lys_module *
ly_ctx_load_module(struct ly_ctx *ctx, const char *name, const char *revision, const char **features)
{
    struct lys_module *mod = NULL;
    LY_ERR ret = LY_SUCCESS;

    LY_CHECK_ARG_RET(ctx, ctx, name, NULL);

    /* load and parse */
    ret = lys_parse_load(ctx, name, revision, &ctx->unres.creating, &mod);
    LY_CHECK_GOTO(ret, cleanup);

    /* implement */
    ret = _lys_set_implemented(mod, features, &ctx->unres);
    LY_CHECK_GOTO(ret, cleanup);

    if (!(ctx->flags & LY_CTX_EXPLICIT_COMPILE)) {
        /* create dep set for the module and mark all the modules that will be (re)compiled */
        LY_CHECK_GOTO(ret = lys_unres_dep_sets_create(ctx, &ctx->unres.dep_sets, mod), cleanup);

        /* (re)compile the whole dep set (other dep sets will have no modules marked for compilation) */
        LY_CHECK_GOTO(ret = lys_compile_depset_all(ctx, &ctx->unres), cleanup);

        /* unres resolved */
        lys_unres_glob_erase(&ctx->unres);
    }

cleanup:
    if (ret) {
        lys_unres_glob_revert(ctx, &ctx->unres);
        lys_unres_glob_erase(&ctx->unres);
        mod = NULL;
    }
    return mod;
}